

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv_strerror_r(int err,char *buf,size_t buflen)

{
  size_t buflen_local;
  char *buf_local;
  int err_local;
  
  if (err == -0xfff) {
    snprintf(buf,buflen,"%s","end of file");
  }
  else if (err == -0xffe) {
    snprintf(buf,buflen,"%s","unknown error");
  }
  else if (err == -0xff0) {
    snprintf(buf,buflen,"%s","invalid Unicode character");
  }
  else if (err == -0xfbc) {
    snprintf(buf,buflen,"%s","inappropriate file type or format");
  }
  else if (err == -0xbc6) {
    snprintf(buf,buflen,"%s","resolved protocol is unknown");
  }
  else if (err == -0xbc5) {
    snprintf(buf,buflen,"%s","invalid value for hints");
  }
  else if (err == -0xbc3) {
    snprintf(buf,buflen,"%s","socket type not supported");
  }
  else if (err == -0xbc2) {
    snprintf(buf,buflen,"%s","service not available for socket type");
  }
  else if (err == -0xbc1) {
    snprintf(buf,buflen,"%s","argument buffer overflow");
  }
  else if (err == -0xbc0) {
    snprintf(buf,buflen,"%s","unknown node or service");
  }
  else if (err == -0xbbf) {
    snprintf(buf,buflen,"%s","no address");
  }
  else if (err == -0xbbe) {
    snprintf(buf,buflen,"%s","out of memory");
  }
  else if (err == -0xbbd) {
    snprintf(buf,buflen,"%s","ai_family not supported");
  }
  else if (err == -0xbbc) {
    snprintf(buf,buflen,"%s","permanent failure");
  }
  else if (err == -0xbbb) {
    snprintf(buf,buflen,"%s","request canceled");
  }
  else if (err == -0xbba) {
    snprintf(buf,buflen,"%s","bad ai_flags value");
  }
  else if (err == -0xbb9) {
    snprintf(buf,buflen,"%s","temporary failure");
  }
  else if (err == -3000) {
    snprintf(buf,buflen,"%s","address family not supported");
  }
  else if (err == -0x7d) {
    snprintf(buf,buflen,"%s","operation canceled");
  }
  else if (err == -0x79) {
    snprintf(buf,buflen,"%s","remote I/O error");
  }
  else if (err == -0x72) {
    snprintf(buf,buflen,"%s","connection already in progress");
  }
  else if (err == -0x71) {
    snprintf(buf,buflen,"%s","host is unreachable");
  }
  else if (err == -0x70) {
    snprintf(buf,buflen,"%s","host is down");
  }
  else if (err == -0x6f) {
    snprintf(buf,buflen,"%s","connection refused");
  }
  else if (err == -0x6e) {
    snprintf(buf,buflen,"%s","connection timed out");
  }
  else if (err == -0x6c) {
    snprintf(buf,buflen,"%s","cannot send after transport endpoint shutdown");
  }
  else if (err == -0x6b) {
    snprintf(buf,buflen,"%s","socket is not connected");
  }
  else if (err == -0x6a) {
    snprintf(buf,buflen,"%s","socket is already connected");
  }
  else if (err == -0x69) {
    snprintf(buf,buflen,"%s","no buffer space available");
  }
  else if (err == -0x68) {
    snprintf(buf,buflen,"%s","connection reset by peer");
  }
  else if (err == -0x67) {
    snprintf(buf,buflen,"%s","software caused connection abort");
  }
  else if (err == -0x65) {
    snprintf(buf,buflen,"%s","network is unreachable");
  }
  else if (err == -100) {
    snprintf(buf,buflen,"%s","network is down");
  }
  else if (err == -99) {
    snprintf(buf,buflen,"%s","address not available");
  }
  else if (err == -0x62) {
    snprintf(buf,buflen,"%s","address already in use");
  }
  else if (err == -0x61) {
    snprintf(buf,buflen,"%s","address family not supported");
  }
  else if (err == -0x5f) {
    snprintf(buf,buflen,"%s","operation not supported on socket");
  }
  else if (err == -0x5e) {
    snprintf(buf,buflen,"%s","socket type not supported");
  }
  else if (err == -0x5d) {
    snprintf(buf,buflen,"%s","protocol not supported");
  }
  else if (err == -0x5c) {
    snprintf(buf,buflen,"%s","protocol not available");
  }
  else if (err == -0x5b) {
    snprintf(buf,buflen,"%s","protocol wrong type for socket");
  }
  else if (err == -0x5a) {
    snprintf(buf,buflen,"%s","message too long");
  }
  else if (err == -0x59) {
    snprintf(buf,buflen,"%s","destination address required");
  }
  else if (err == -0x58) {
    snprintf(buf,buflen,"%s","socket operation on non-socket");
  }
  else if (err == -0x54) {
    snprintf(buf,buflen,"%s","illegal byte sequence");
  }
  else if (err == -0x4b) {
    snprintf(buf,buflen,"%s","value too large for defined data type");
  }
  else if (err == -0x47) {
    snprintf(buf,buflen,"%s","protocol error");
  }
  else if (err == -0x40) {
    snprintf(buf,buflen,"%s","machine is not on the network");
  }
  else if (err == -0x3d) {
    snprintf(buf,buflen,"%s","no data available");
  }
  else if (err == -0x31) {
    snprintf(buf,buflen,"%s","protocol driver not attached");
  }
  else if (err == -0x28) {
    snprintf(buf,buflen,"%s","too many symbolic links encountered");
  }
  else if (err == -0x27) {
    snprintf(buf,buflen,"%s","directory not empty");
  }
  else if (err == -0x26) {
    snprintf(buf,buflen,"%s","function not implemented");
  }
  else if (err == -0x24) {
    snprintf(buf,buflen,"%s","name too long");
  }
  else if (err == -0x22) {
    snprintf(buf,buflen,"%s","result too large");
  }
  else if (err == -0x20) {
    snprintf(buf,buflen,"%s","broken pipe");
  }
  else if (err == -0x1f) {
    snprintf(buf,buflen,"%s","too many links");
  }
  else if (err == -0x1e) {
    snprintf(buf,buflen,"%s","read-only file system");
  }
  else if (err == -0x1d) {
    snprintf(buf,buflen,"%s","invalid seek");
  }
  else if (err == -0x1c) {
    snprintf(buf,buflen,"%s","no space left on device");
  }
  else if (err == -0x1b) {
    snprintf(buf,buflen,"%s","file too large");
  }
  else if (err == -0x1a) {
    snprintf(buf,buflen,"%s","text file is busy");
  }
  else if (err == -0x19) {
    snprintf(buf,buflen,"%s","inappropriate ioctl for device");
  }
  else if (err == -0x18) {
    snprintf(buf,buflen,"%s","too many open files");
  }
  else if (err == -0x17) {
    snprintf(buf,buflen,"%s","file table overflow");
  }
  else if (err == -0x16) {
    snprintf(buf,buflen,"%s","invalid argument");
  }
  else if (err == -0x15) {
    snprintf(buf,buflen,"%s","illegal operation on a directory");
  }
  else if (err == -0x14) {
    snprintf(buf,buflen,"%s","not a directory");
  }
  else if (err == -0x13) {
    snprintf(buf,buflen,"%s","no such device");
  }
  else if (err == -0x12) {
    snprintf(buf,buflen,"%s","cross-device link not permitted");
  }
  else if (err == -0x11) {
    snprintf(buf,buflen,"%s","file already exists");
  }
  else if (err == -0x10) {
    snprintf(buf,buflen,"%s","resource busy or locked");
  }
  else if (err == -0xe) {
    snprintf(buf,buflen,"%s","bad address in system call argument");
  }
  else if (err == -0xd) {
    snprintf(buf,buflen,"%s","permission denied");
  }
  else if (err == -0xc) {
    snprintf(buf,buflen,"%s","not enough memory");
  }
  else if (err == -0xb) {
    snprintf(buf,buflen,"%s","resource temporarily unavailable");
  }
  else if (err == -9) {
    snprintf(buf,buflen,"%s","bad file descriptor");
  }
  else if (err == -7) {
    snprintf(buf,buflen,"%s","argument list too long");
  }
  else if (err == -6) {
    snprintf(buf,buflen,"%s","no such device or address");
  }
  else if (err == -5) {
    snprintf(buf,buflen,"%s","i/o error");
  }
  else if (err == -4) {
    snprintf(buf,buflen,"%s","interrupted system call");
  }
  else if (err == -3) {
    snprintf(buf,buflen,"%s","no such process");
  }
  else if (err == -2) {
    snprintf(buf,buflen,"%s","no such file or directory");
  }
  else if (err == -1) {
    snprintf(buf,buflen,"%s","operation not permitted");
  }
  else {
    snprintf(buf,buflen,"Unknown system error %d",(ulong)(uint)err);
  }
  return buf;
}

Assistant:

char* uv_strerror_r(int err, char* buf, size_t buflen) {
  switch (err) {
    UV_ERRNO_MAP(UV_STRERROR_GEN_R)
    default: snprintf(buf, buflen, "Unknown system error %d", err);
  }
  return buf;
}